

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ovf.cpp
# Opt level: O2

char * ovf_latest_message(ovf_file *ovf_file_ptr)

{
  char *pcVar1;
  
  pcVar1 = "";
  if (ovf_file_ptr != (ovf_file *)0x0) {
    std::__cxx11::string::_M_assign((string *)&ovf_file_ptr->_state->message_out);
    std::__cxx11::string::assign((char *)&ovf_file_ptr->_state->message_latest);
    pcVar1 = (ovf_file_ptr->_state->message_out)._M_dataplus._M_p;
  }
  return pcVar1;
}

Assistant:

const char * ovf_latest_message(struct ovf_file *ovf_file_ptr)
try
{
    if( !ovf_file_ptr )
        return "";

    ovf_file_ptr->_state->message_out = ovf_file_ptr->_state->message_latest;
    ovf_file_ptr->_state->message_latest = "";
    return ovf_file_ptr->_state->message_out.c_str();
}
catch( ... )
{
    return "";
}